

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

void get_range<double,int>
               (size_t *ix_arr,size_t st,size_t end,size_t col_num,double *Xc,int *Xc_ind,
               int *Xc_indptr,MissingAction missing_action,double *xmin,double *xmax,
               bool *unsplittable)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  int *piVar8;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  bool bVar9;
  __type _Var10;
  undefined4 uVar11;
  undefined4 uVar12;
  long in_stack_00000008;
  int in_stack_00000010;
  double *in_stack_00000018;
  double *in_stack_00000020;
  byte *in_stack_00000028;
  size_t *row_1;
  size_t *row;
  size_t nmatches;
  size_t ind_end_col;
  size_t curr_pos;
  size_t nnz_col;
  size_t end_col;
  size_t st_col;
  byte local_e1;
  unsigned_long *in_stack_ffffffffffffff30;
  unsigned_long *in_stack_ffffffffffffff38;
  unsigned_long *in_stack_ffffffffffffff40;
  double local_90;
  double local_88;
  ulong *local_70;
  ulong *local_68;
  ulong local_60;
  long local_50;
  
  *in_stack_00000018 = INFINITY;
  *in_stack_00000020 = -INFINITY;
  local_50 = (long)*(int *)(in_stack_00000008 + in_RCX * 4);
  lVar5 = (long)*(int *)(in_stack_00000008 + 4 + in_RCX * 4);
  lVar6 = lVar5 + -1;
  if (((lVar5 == local_50) ||
      ((int)*(undefined8 *)(in_RDI + in_RDX * 8) < *(int *)(in_R9 + local_50 * 4))) ||
     (*(int *)(in_R9 + lVar6 * 4) < (int)*(undefined8 *)(in_RDI + in_RSI * 8))) {
    *in_stack_00000028 = 1;
    return;
  }
  if ((((ulong)(lVar5 - local_50) < (in_RDX - in_RSI) + 1U) ||
      ((int)*(undefined8 *)(in_RDI + in_RSI * 8) < *(int *)(in_R9 + local_50 * 4))) ||
     (*(int *)(in_R9 + lVar6 * 4) < (int)*(undefined8 *)(in_RDI + in_RDX * 8))) {
    *in_stack_00000018 = 0.0;
    *in_stack_00000020 = 0.0;
  }
  uVar7 = (ulong)*(int *)(in_R9 + lVar6 * 4);
  local_60 = 0;
  if (in_stack_00000010 == 0) {
    local_68 = std::lower_bound<unsigned_long*,int>
                         (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                          (int *)in_stack_ffffffffffffff30);
    while( true ) {
      bVar9 = false;
      if ((local_68 != (ulong *)(in_RDI + in_RDX * 8 + 8)) && (bVar9 = false, local_50 != lVar5)) {
        bVar9 = *local_68 <= uVar7;
      }
      if (!bVar9) break;
      if (*(int *)(in_R9 + local_50 * 4) == (int)*local_68) {
        local_60 = local_60 + 1;
        if (*in_stack_00000018 <= *(double *)(in_R8 + local_50 * 8)) {
          local_88 = *in_stack_00000018;
        }
        else {
          local_88 = *(double *)(in_R8 + local_50 * 8);
        }
        *in_stack_00000018 = local_88;
        dVar1 = *(double *)(in_R8 + local_50 * 8);
        if (dVar1 < *in_stack_00000020 || dVar1 == *in_stack_00000020) {
          local_90 = *in_stack_00000020;
        }
        else {
          local_90 = *(double *)(in_R8 + local_50 * 8);
        }
        *in_stack_00000020 = local_90;
        if ((local_68 == (ulong *)(in_RDI + in_RDX * 8)) || (local_50 == lVar6)) break;
        local_68 = local_68 + 1;
        piVar8 = std::lower_bound<int*,unsigned_long>
                           ((int *)in_stack_ffffffffffffff40,(int *)in_stack_ffffffffffffff38,
                            in_stack_ffffffffffffff30);
        local_50 = (long)piVar8 - in_R9 >> 2;
      }
      else if ((int)*local_68 < *(int *)(in_R9 + local_50 * 4)) {
        local_68 = std::lower_bound<unsigned_long*,int>
                             (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                              (int *)in_stack_ffffffffffffff30);
      }
      else {
        piVar8 = std::lower_bound<int*,unsigned_long>
                           ((int *)in_stack_ffffffffffffff40,(int *)in_stack_ffffffffffffff38,
                            in_stack_ffffffffffffff30);
        local_50 = (long)piVar8 - in_R9 >> 2;
      }
    }
  }
  else {
    local_70 = std::lower_bound<unsigned_long*,int>
                         (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                          (int *)in_stack_ffffffffffffff30);
    while( true ) {
      bVar9 = false;
      if ((local_70 != (ulong *)(in_RDI + in_RDX * 8 + 8)) && (bVar9 = false, local_50 != lVar5)) {
        bVar9 = *local_70 <= uVar7;
      }
      if (!bVar9) break;
      if (*(int *)(in_R9 + local_50 * 4) == (int)*local_70) {
        local_60 = local_60 + 1;
        dVar1 = *in_stack_00000018;
        dVar2 = *(double *)(in_R8 + local_50 * 8);
        uVar11 = SUB84(dVar2,0);
        uVar12 = (int)((ulong)dVar2 >> 0x20);
        if (dVar1 <= dVar2) {
          uVar11 = SUB84(dVar1,0);
          uVar12 = (int)((ulong)dVar1 >> 0x20);
        }
        *in_stack_00000018 =
             (double)(~-(ulong)NAN(dVar1) & CONCAT44(uVar12,uVar11) |
                     -(ulong)NAN(dVar1) & (ulong)dVar2);
        dVar1 = *in_stack_00000020;
        dVar2 = *(double *)(in_R8 + local_50 * 8);
        uVar11 = SUB84(dVar2,0);
        uVar12 = (int)((ulong)dVar2 >> 0x20);
        if (dVar2 <= dVar1) {
          uVar11 = SUB84(dVar1,0);
          uVar12 = (int)((ulong)dVar1 >> 0x20);
        }
        *in_stack_00000020 =
             (double)(~-(ulong)NAN(dVar1) & CONCAT44(uVar12,uVar11) |
                     -(ulong)NAN(dVar1) & (ulong)dVar2);
        if ((local_70 == (ulong *)(in_RDI + in_RDX * 8)) || (local_50 == lVar6)) break;
        local_70 = local_70 + 1;
        in_stack_ffffffffffffff40 =
             (unsigned_long *)
             std::lower_bound<int*,unsigned_long>
                       ((int *)in_stack_ffffffffffffff40,(int *)in_stack_ffffffffffffff38,
                        in_stack_ffffffffffffff30);
        local_50 = (long)in_stack_ffffffffffffff40 - in_R9 >> 2;
      }
      else if ((int)*local_70 < *(int *)(in_R9 + local_50 * 4)) {
        in_stack_ffffffffffffff38 =
             std::lower_bound<unsigned_long*,int>
                       (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                        (int *)in_stack_ffffffffffffff30);
        local_70 = in_stack_ffffffffffffff38;
      }
      else {
        in_stack_ffffffffffffff30 =
             (unsigned_long *)
             std::lower_bound<int*,unsigned_long>
                       ((int *)in_stack_ffffffffffffff40,(int *)in_stack_ffffffffffffff38,
                        in_stack_ffffffffffffff30);
        local_50 = (long)in_stack_ffffffffffffff30 - in_R9 >> 2;
      }
    }
  }
  if (local_60 < (in_RDX - in_RSI) + 1U) {
    _Var10 = std::fmin<double,int>(*in_stack_00000018,0);
    *in_stack_00000018 = _Var10;
    _Var10 = std::fmax<double,int>(*in_stack_00000020,0);
    *in_stack_00000020 = _Var10;
  }
  local_e1 = 1;
  if ((*in_stack_00000018 != *in_stack_00000020) ||
     (NAN(*in_stack_00000018) || NAN(*in_stack_00000020))) {
    if ((*in_stack_00000018 == INFINITY) && (!NAN(*in_stack_00000018))) {
      local_e1 = 1;
      if ((*in_stack_00000020 == -INFINITY) && (!NAN(*in_stack_00000020))) goto LAB_0021d867;
    }
    uVar3 = std::isnan(*in_stack_00000018);
    local_e1 = 1;
    if ((uVar3 & 1) == 0) {
      iVar4 = std::isnan(*in_stack_00000020);
      local_e1 = (byte)iVar4;
    }
  }
LAB_0021d867:
  *in_stack_00000028 = local_e1 & 1;
  return;
}

Assistant:

void get_range(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
               real_t *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
               MissingAction missing_action, double &restrict xmin, double &restrict xmax, bool &unsplittable) noexcept
{
    /* ix_arr must already be sorted beforehand */
    xmin =  HUGE_VAL;
    xmax = -HUGE_VAL;

    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1];
    size_t nnz_col = end_col - st_col;
    end_col--;
    size_t curr_pos = st_col;

    if (!nnz_col || 
        Xc_ind[st_col]         >   (sparse_ix)ix_arr[end] || 
        (sparse_ix)ix_arr[st]  >   Xc_ind[end_col]
        )
    {
        unsplittable = true;
        return;
    }

    if (nnz_col < end - st + 1 ||
        Xc_ind[st_col]  > (sparse_ix)ix_arr[st] ||
        Xc_ind[end_col] < (sparse_ix)ix_arr[end]
        )
    {
        xmin = 0;
        xmax = 0;
    }

    size_t ind_end_col = Xc_ind[end_col];
    size_t nmatches = 0;

    if (missing_action == Fail)
    {
        for (size_t *row = std::lower_bound(ix_arr + st, ix_arr + end + 1, Xc_ind[st_col]);
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                nmatches++;
                xmin = (Xc[curr_pos] < xmin)? Xc[curr_pos] : xmin;
                xmax = (Xc[curr_pos] > xmax)? Xc[curr_pos] : xmax;
                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }
    }

    else /* can have NAs */
    {
        for (size_t *row = std::lower_bound(ix_arr + st, ix_arr + end + 1, Xc_ind[st_col]);
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                nmatches++;
                xmin = std::fmin(xmin, Xc[curr_pos]);
                xmax = std::fmax(xmax, Xc[curr_pos]);
                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }

    }

    if (nmatches < (end - st + 1))
    {
        xmin = std::fmin(xmin, 0);
        xmax = std::fmax(xmax, 0);
    }

    unsplittable = (xmin == xmax) || (xmin == HUGE_VAL && xmax == -HUGE_VAL) || std::isnan(xmin) || std::isnan(xmax);
}